

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void print_live_ranges(gen_ctx_t gen_ctx,live_range_t_conflict lr)

{
  lr_bb_t_conflict lr_bb;
  lr_bb_t_conflict plVar1;
  
  if (lr != (live_range_t_conflict)0x0) {
    do {
      fprintf((FILE *)gen_ctx->debug_file," [%d..%d]",(ulong)(uint)lr->start,(ulong)(uint)lr->finish
             );
      plVar1 = lr->lr_bb;
      if (plVar1 != (lr_bb_t_conflict)0x0) {
        do {
          fprintf((FILE *)gen_ctx->debug_file,"%cbb%lu",
                  (ulong)((uint)(plVar1 == lr->lr_bb) * 8 + 0x20),plVar1->bb->index);
          plVar1 = plVar1->next;
        } while (plVar1 != (lr_bb_t)0x0);
        fputc(0x29,(FILE *)gen_ctx->debug_file);
      }
      lr = lr->next;
    } while (lr != (live_range_t)0x0);
  }
  fputc(10,(FILE *)gen_ctx->debug_file);
  return;
}

Assistant:

static void print_live_ranges (gen_ctx_t gen_ctx, live_range_t lr) {
  for (; lr != NULL; lr = lr->next) print_live_range (gen_ctx, lr);
  fprintf (debug_file, "\n");
}